

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distort.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  ostream *poVar7;
  pointer piVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  string fn_dst;
  string fn_param;
  string fn_image;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pts_distort;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pts_ud;
  Mat map_x;
  Mat R;
  Mat cam_mtx_ud;
  Mat image_distort;
  Mat map_y;
  Mat cam_mtx;
  Mat dis_cef;
  Mat image_ud;
  long *local_448;
  void **ppvStack_440;
  long local_438 [2];
  long *local_428;
  char *local_420;
  long local_418 [2];
  long *local_408;
  char *local_400;
  long local_3f8 [2];
  void *local_3e8;
  undefined8 uStack_3e0;
  long local_3d8;
  void *local_3c8;
  undefined8 uStack_3c0;
  long local_3b8;
  _InputArray local_3a8;
  vector<int,_std::allocator<int>_> local_388 [3];
  long *local_340;
  undefined1 *local_328;
  undefined8 local_320;
  undefined1 local_318;
  undefined7 uStack_317;
  _InputArray local_2c8;
  FileStorage local_2b0 [96];
  int local_250;
  uint local_24c;
  int local_248;
  uint local_244;
  _InputArray local_240 [4];
  _InputArray local_1e0;
  _InputArray local_1c8;
  Mat local_1b0 [16];
  long local_1a0;
  long *local_168;
  Mat local_150 [96];
  Mat local_f0 [96];
  string local_90 [96];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "2. Distort: input camera params and one undistorted image, then get the distorted image."
             ,0x58);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  local_408 = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"undistort.png","");
  local_428 = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"params.json","");
  pcVar4 = local_400;
  if (1 < argc) {
    pcVar1 = argv[1];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_408,0,pcVar4,(ulong)pcVar1);
    pcVar4 = local_420;
    if (argc != 2) {
      pcVar1 = argv[2];
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)&local_428,0,pcVar4,(ulong)pcVar1);
    }
  }
  cv::imread(local_90,(int)&local_408);
  cVar5 = cv::Mat::empty();
  if (cVar5 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cannot load image: ",0x13);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_408,(long)local_400);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    goto LAB_001027b9;
  }
  cv::Mat::Mat(local_150);
  cv::Mat::Mat(local_f0);
  cv::FileStorage::FileStorage(local_2b0);
  local_320 = 0;
  local_318 = 0;
  local_328 = &local_318;
  cVar5 = cv::FileStorage::open((string *)local_2b0,(int)&local_428,(string *)0x0);
  if (local_328 != &local_318) {
    operator_delete(local_328,CONCAT71(uStack_317,local_318) + 1);
  }
  if (cVar5 == '\0') {
LAB_00102735:
    cv::FileStorage::~FileStorage(local_2b0);
LAB_00102742:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cannot load camera params from ",0x1f);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_428,(long)local_420);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  else {
    cv::FileStorage::operator[]((char *)local_388);
    cv::Mat::Mat((Mat *)&local_328);
    cv::read((FileNode *)local_388,local_150,(Mat *)&local_328);
    cv::Mat::~Mat((Mat *)&local_328);
    cv::FileStorage::operator[]((char *)local_388);
    cv::Mat::Mat((Mat *)&local_328);
    cv::read((FileNode *)local_388,local_f0,(Mat *)&local_328);
    cv::Mat::~Mat((Mat *)&local_328);
    cv::FileStorage::operator[]((char *)local_1b0);
    local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cv::FileNode::begin();
    local_240[0]._0_8_ = &local_328;
    cv::internal::VecReaderProxy<int,_1>::operator()
              ((VecReaderProxy<int,_1> *)local_240,local_388,0x7fffffff);
    if ((long)local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      uVar9 = *local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[1];
LAB_001026fc:
      operator_delete(local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      uVar14 = (ulong)uVar9;
    }
    else {
      uVar12 = 0;
      uVar9 = 0;
      uVar14 = 0;
      if ((uint *)local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) goto LAB_001026fc;
    }
    cVar5 = cv::Mat::empty();
    if (cVar5 != '\0') goto LAB_00102735;
    cVar5 = cv::Mat::empty();
    if (cVar5 != '\0') goto LAB_00102735;
    iVar13 = (int)uVar14;
    cv::FileStorage::~FileStorage(local_2b0);
    if ((int)(iVar13 * uVar12) < 1) goto LAB_00102742;
    cv::Mat::Mat((Mat *)&local_328);
    cv::Mat::clone();
    local_248 = iVar13;
    local_244 = uVar12;
    cv::Mat::Mat((Mat *)local_388,&local_248,5);
    local_250 = iVar13;
    local_24c = uVar12;
    cv::Mat::Mat(local_1b0,&local_250,5);
    local_3c8 = (void *)0x0;
    uStack_3c0 = 0;
    iVar6 = 0;
    local_3b8 = 0;
    local_3d8 = 0;
    local_3e8 = (void *)0x0;
    uStack_3e0 = 0;
    local_240[0]._0_8_ = local_240[0]._0_8_ & 0xffffffff00000000;
    if (0 < (int)uVar12) {
      do {
        local_448 = (long *)((ulong)local_448 & 0xffffffff00000000);
        if (0 < iVar13) {
          do {
            std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::
            emplace_back<int&,int&>
                      ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_3e8,
                       (int *)&local_448,&local_240[0].flags);
            iVar6 = (int)local_448 + 1;
            local_448 = (long *)CONCAT44(local_448._4_4_,iVar6);
          } while (iVar6 < iVar13);
          iVar6 = local_240[0].flags;
        }
        iVar6 = iVar6 + 1;
        local_240[0].flags = iVar6;
      } while (iVar6 < (int)uVar12);
    }
    local_240[0].sz.width = 0;
    local_240[0].sz.height = 0;
    local_240[0].flags = 0x8103000d;
    local_240[0].obj = &local_3e8;
    local_438[0] = 0;
    local_448 = (long *)CONCAT44(local_448._4_4_,0x8203000d);
    ppvStack_440 = &local_3c8;
    local_2c8.sz.width = 0;
    local_2c8.sz.height = 0;
    local_2c8.flags = 0x1010000;
    local_2c8.obj = local_150;
    local_3a8.sz.width = 0;
    local_3a8.sz.height = 0;
    local_3a8.flags = 0x1010000;
    local_3a8.obj = local_f0;
    local_1c8.sz.width = 0;
    local_1c8.sz.height = 0;
    local_1c8.flags = 0x1010000;
    local_1c8.obj = &local_328;
    local_1e0.sz.width = 0;
    local_1e0.sz.height = 0;
    local_1e0.flags = 0x1010000;
    local_1e0.obj = local_2b0;
    cv::undistortPoints(local_240,(_OutputArray *)&local_448,&local_2c8,&local_3a8,&local_1c8,
                        &local_1e0);
    if (0 < (int)uVar12) {
      lVar2 = *local_340;
      lVar3 = *local_168;
      lVar10 = (long)local_3c8 + 4;
      uVar11 = 0;
      piVar8 = local_388[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      do {
        if (0 < iVar13) {
          uVar15 = 0;
          do {
            piVar8[uVar15] = *(int *)(lVar10 + -4 + uVar15 * 8);
            *(undefined4 *)(local_1a0 + uVar15 * 4) = *(undefined4 *)(lVar10 + uVar15 * 8);
            uVar15 = uVar15 + 1;
          } while (uVar14 != uVar15);
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + uVar14 * 8;
        local_1a0 = local_1a0 + lVar3;
        piVar8 = (pointer)((long)piVar8 + lVar2);
      } while (uVar11 != uVar12);
    }
    cv::Mat::Mat((Mat *)local_240);
    local_2c8.sz.width = 0;
    local_2c8.sz.height = 0;
    local_2c8.flags = 0x1010000;
    local_3a8.sz.width = 0;
    local_3a8.sz.height = 0;
    local_3a8.flags = 0x2010000;
    local_1c8.sz.width = 0;
    local_1c8.sz.height = 0;
    local_1c8.flags = 0x1010000;
    local_1c8.obj = local_388;
    local_1e0.sz.width = 0;
    local_1e0.sz.height = 0;
    local_1e0.flags = 0x1010000;
    local_1e0.obj = local_1b0;
    local_438[0] = 0;
    local_438[1] = 0;
    local_448 = (long *)0x0;
    ppvStack_440 = (void **)0x0;
    local_3a8.obj = local_240;
    local_2c8.obj = local_90;
    cv::remap(&local_2c8,(_OutputArray *)&local_3a8,&local_1c8,&local_1e0,1,0,(Scalar_ *)&local_448)
    ;
    local_448 = local_438;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"distort.png","");
    local_2c8.sz.width = 0;
    local_2c8.sz.height = 0;
    local_2c8.flags = 0x1010000;
    local_3a8.sz.width = 0;
    local_3a8.sz.height = 0;
    local_3a8._0_8_ = (void *)0x0;
    local_3a8.obj = (void *)0x0;
    local_2c8.obj = local_240;
    cv::imwrite((string *)&local_448,&local_2c8,(vector *)&local_3a8);
    if ((void *)local_3a8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_3a8._0_8_,(long)local_3a8.sz - local_3a8._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"image saved to ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_448,(long)ppvStack_440);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_448 != local_438) {
      operator_delete(local_448,local_438[0] + 1);
    }
    cv::Mat::~Mat((Mat *)local_240);
    if (local_3e8 != (void *)0x0) {
      operator_delete(local_3e8,local_3d8 - (long)local_3e8);
    }
    if (local_3c8 != (void *)0x0) {
      operator_delete(local_3c8,local_3b8 - (long)local_3c8);
    }
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat((Mat *)local_388);
    cv::Mat::~Mat((Mat *)local_2b0);
    cv::Mat::~Mat((Mat *)&local_328);
  }
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_150);
LAB_001027b9:
  cv::Mat::~Mat((Mat *)local_90);
  if (local_428 != local_418) {
    operator_delete(local_428,local_418[0] + 1);
  }
  if (local_408 != local_3f8) {
    operator_delete(local_408,local_3f8[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    cout << "2. Distort: input camera params and one undistorted image, then get the distorted image." << endl;

    string fn_image = "undistort.png";
    string fn_param = "params.json";
    if (argc > 1)
        fn_image = argv[1];
    if (argc > 2)
        fn_param = argv[2];
    Mat image_ud = imread(fn_image, IMREAD_GRAYSCALE);
    if (image_ud.empty()) {
        cout << "cannot load image: " << fn_image << endl;
        return 0;
    }
    Mat cam_mtx, dis_cef;
    Size image_size;
    auto loadParams = [&]() {
        FileStorage fs;
        if (!fs.open(fn_param, FileStorage::READ))
            return false;
        fs["cam_mtx"] >> cam_mtx;
        fs["dis_cef"] >> dis_cef;
        fs["image_size"] >> image_size;
        return !cam_mtx.empty() && !dis_cef.empty() && image_size.area() > 0;
    };
    if (!loadParams()) {
        cout << "cannot load camera params from " << fn_param << endl;
        return 0;
    }

    Mat R;
    Mat cam_mtx_ud = cam_mtx.clone();

    // add distortion
    Mat map_x = Mat(image_size, CV_32FC1);
    Mat map_y = Mat(image_size, CV_32FC1);
    vector<Point2f> pts_ud, pts_distort;
    for (int y = 0; y < image_size.height; ++y)
        for (int x = 0; x < image_size.width; ++x)
            pts_distort.emplace_back(x, y);
    undistortPoints(pts_distort, pts_ud, cam_mtx, dis_cef, R, cam_mtx_ud);
    for (int y = 0; y < image_size.height; ++y) {
        float* ptr1 = map_x.ptr<float>(y);
        float* ptr2 = map_y.ptr<float>(y);
        for (int x = 0; x < image_size.width; ++x) {
            const auto& pt = pts_ud[y * image_size.width + x];
            ptr1[x] = pt.x;
            ptr2[x] = pt.y;
        }
    }
    Mat image_distort;
    remap(image_ud, image_distort, map_x, map_y, INTER_LINEAR);

    string fn_dst = "distort.png";
    imwrite(fn_dst, image_distort);
    cout << "image saved to " << fn_dst << endl;

    return 0;
}